

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

void __thiscall cfd::core::HashUtil::HashUtil(HashUtil *this,string *hash_type)

{
  long lVar1;
  __type _Var2;
  size_t index;
  ulong uVar3;
  CfdException *pCVar4;
  long lVar5;
  allocator local_71;
  string name;
  string local_50;
  
  this->_vptr_HashUtil = (_func_int **)&PTR__HashUtil_00654508;
  ByteData::ByteData(&this->buffer_);
  if (0x14 < hash_type->_M_string_length) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&name,"unsupported hash type.",(allocator *)&local_50);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&name);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::__cxx11::string::string((string *)&name,(string *)hash_type);
  for (uVar3 = 0; uVar3 < name._M_string_length; uVar3 = uVar3 + 1) {
    if ((byte)(name._M_dataplus._M_p[uVar3] + 0xbfU) < 0x1a) {
      name._M_dataplus._M_p[uVar3] = name._M_dataplus._M_p[uVar3] | 0x20;
    }
  }
  lVar1 = 0;
  while ((lVar5 = lVar1, lVar5 != 0xf0 && (kFormatList[lVar5 + 0x20] != '\0'))) {
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(kFormatList + lVar5));
    lVar1 = lVar5 + 0x28;
    if (_Var2) {
      this->hash_type_ = kFormatList[lVar5 + 0x20];
      ::std::__cxx11::string::~string((string *)&name);
      return;
    }
  }
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_50,"unsupported hash type.",&local_71);
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_50);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

HashUtil::HashUtil(const std::string &hash_type) {
  if (hash_type.length() > 20)
    throw CfdException(kCfdIllegalArgumentError, "unsupported hash type.");

  std::string name = hash_type;
  for (size_t index = 0; index < name.length(); ++index) {
    if ((name[index] >= 'A') && (name[index] <= 'Z')) {
      name[index] += 'a' - 'A';
    }
  }
  for (const auto &item : kFormatList) {
    if (item.type == 0) break;
    if (name == item.name) {
      hash_type_ = item.type;
      return;
    }
  }
  throw CfdException(kCfdIllegalArgumentError, "unsupported hash type.");
}